

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_mesh.c
# Opt level: O3

void build_bvh_tree(BVHNode *bvh_root,TriangleMesh *mesh,Centroid *centroids_by_x,
                   Centroid *centroids_by_y,Centroid *centroids_by_z,uint depth,
                   Triangle *new_triangles)

{
  float *pfVar1;
  long lVar2;
  Triangle *pTVar3;
  size_t sVar4;
  int iVar5;
  undefined8 *__ptr;
  void *pvVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  bool bVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  undefined4 *puVar17;
  uint uVar18;
  undefined4 *puVar19;
  Centroid *pCVar20;
  size_t *psVar21;
  size_t sVar22;
  byte bVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  Triangle *local_60;
  
  bVar23 = 0;
  __ptr = (undefined8 *)malloc(0x20);
  *__ptr = bvh_root;
  *(undefined4 *)(__ptr + 2) = 0;
  sVar22 = mesh->triangle_count;
  pvVar6 = malloc(sVar22);
  __ptr[1] = pvVar6;
  __ptr[3] = 0;
  local_60 = new_triangles;
  if (sVar22 != 0) {
    memset(pvVar6,1,sVar22);
  }
  do {
    puVar11 = (undefined8 *)__ptr[3];
    pfVar1 = (float *)*__ptr;
    lVar2 = __ptr[1];
    pfVar1[0] = INFINITY;
    pfVar1[1] = INFINITY;
    pfVar1[2] = INFINITY;
    pfVar1[3] = -INFINITY;
    pfVar1[4] = -INFINITY;
    pfVar1[5] = -INFINITY;
    sVar22 = mesh->triangle_count;
    if (sVar22 == 0) {
      *(undefined1 *)(pfVar1 + 6) = 1;
LAB_001094cf:
      *(Triangle **)(pfVar1 + 8) = local_60;
      pfVar1[10] = 0.0;
      uVar14 = mesh->triangle_count;
      lVar7 = 0;
      if (uVar14 != 0) {
        uVar15 = 0;
        do {
          if (*(char *)(lVar2 + uVar15) == '\x01') {
            fVar24 = pfVar1[10];
            pfVar1[10] = (float)((int)fVar24 + 1);
            puVar17 = (undefined4 *)((long)&mesh->triangles->vertices[0].x + lVar7);
            puVar19 = (undefined4 *)((long)(int)fVar24 * 0x48 + *(long *)(pfVar1 + 8));
            for (lVar16 = 0x12; lVar16 != 0; lVar16 = lVar16 + -1) {
              *puVar19 = *puVar17;
              puVar17 = puVar17 + (ulong)bVar23 * -2 + 1;
              puVar19 = puVar19 + (ulong)bVar23 * -2 + 1;
            }
            uVar14 = mesh->triangle_count;
          }
          uVar15 = uVar15 + 1;
          lVar7 = lVar7 + 0x48;
        } while (uVar15 < uVar14);
        lVar7 = (long)(int)pfVar1[10];
      }
      local_60 = local_60 + lVar7;
    }
    else {
      lVar7 = 0;
      fVar27 = -INFINITY;
      fVar24 = -INFINITY;
      fVar29 = INFINITY;
      fVar26 = INFINITY;
      fVar25 = -INFINITY;
      fVar28 = INFINITY;
      uVar18 = 0;
      sVar13 = 0;
      do {
        if (*(char *)(lVar2 + sVar13) == '\x01') {
          pTVar3 = mesh->triangles;
          lVar16 = 8;
          do {
            fVar30 = *(float *)((long)pTVar3->vertices + lVar16 + lVar7 + -8);
            if (fVar30 < fVar29) {
              *pfVar1 = fVar30;
              fVar29 = fVar30;
              fVar30 = *(float *)((long)pTVar3->vertices + lVar16 + lVar7 + -8);
            }
            if (fVar27 < fVar30) {
              pfVar1[3] = fVar30;
              fVar27 = fVar30;
            }
            fVar30 = *(float *)((long)pTVar3->vertices + lVar16 + lVar7 + -4);
            if (fVar30 < fVar28) {
              pfVar1[1] = fVar30;
              fVar28 = fVar30;
              fVar30 = *(float *)((long)pTVar3->vertices + lVar16 + lVar7 + -4);
            }
            if (fVar25 < fVar30) {
              pfVar1[4] = fVar30;
              fVar25 = fVar30;
            }
            fVar30 = *(float *)((long)&pTVar3->vertices[0].x + lVar16 + lVar7);
            if (fVar30 < fVar26) {
              pfVar1[2] = fVar30;
              fVar26 = fVar30;
              fVar30 = *(float *)((long)&pTVar3->vertices[0].x + lVar16 + lVar7);
            }
            if (fVar24 < fVar30) {
              pfVar1[5] = fVar30;
              fVar24 = fVar30;
            }
            lVar16 = lVar16 + 0xc;
          } while (lVar16 != 0x2c);
          uVar18 = uVar18 + 1;
        }
        sVar13 = sVar13 + 1;
        lVar7 = lVar7 + 0x48;
      } while (sVar13 != sVar22);
      bVar12 = (int)uVar18 < 6 || 0x13 < depth;
      *(bool *)(pfVar1 + 6) = bVar12;
      if (bVar12) goto LAB_001094cf;
      pCVar20 = centroids_by_x;
      if ((*(uint *)(__ptr + 2) % 3 != 0) &&
         (pCVar20 = centroids_by_z, *(uint *)(__ptr + 2) % 3 != 2)) {
        pCVar20 = centroids_by_y;
      }
      pvVar6 = malloc(sVar22);
      pvVar8 = malloc(sVar22);
      psVar21 = &pCVar20->idx;
      iVar5 = 0;
      do {
        sVar4 = *psVar21;
        *(undefined1 *)((long)pvVar6 + sVar4) = 0;
        *(undefined1 *)((long)pvVar8 + sVar4) = 0;
        if (*(char *)(lVar2 + sVar4) == '\x01') {
          pvVar9 = pvVar8;
          if (iVar5 < (int)(uVar18 >> 1)) {
            pvVar9 = pvVar6;
          }
          *(undefined1 *)(sVar4 + (long)pvVar9) = 1;
          iVar5 = iVar5 + 1;
        }
        psVar21 = psVar21 + 3;
        sVar22 = sVar22 - 1;
      } while (sVar22 != 0);
      pvVar9 = malloc(0x30);
      *(void **)(pfVar1 + 8) = pvVar9;
      pvVar9 = malloc(0x30);
      *(void **)(pfVar1 + 10) = pvVar9;
      puVar10 = (undefined8 *)malloc(0x20);
      *puVar10 = pvVar9;
      puVar10[1] = pvVar8;
      *(int *)(puVar10 + 2) = *(int *)(__ptr + 2) + 1;
      puVar10[3] = puVar11;
      puVar11 = (undefined8 *)malloc(0x20);
      *puVar11 = *(undefined8 *)(pfVar1 + 8);
      puVar11[1] = pvVar6;
      *(int *)(puVar11 + 2) = *(int *)(__ptr + 2) + 1;
      puVar11[3] = puVar10;
    }
    free((void *)__ptr[1]);
    free(__ptr);
    __ptr = puVar11;
    if (puVar11 == (undefined8 *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void build_bvh_tree(BVHNode* bvh_root, TriangleMesh* mesh,
                    Centroid* centroids_by_x, Centroid* centroids_by_y, Centroid* centroids_by_z,
                    unsigned int depth, Triangle* new_triangles) {
    BVHBuildStackNode* stack_head = malloc(sizeof(BVHBuildStackNode));

    stack_head->bvh_node = bvh_root;
    stack_head->depth = 0;
    stack_head->indices = malloc(sizeof(bool) * mesh->triangle_count);
    stack_head->prev = NULL;

    for (size_t i = 0; i < mesh->triangle_count; i++) {
        stack_head->indices[i] = true;
    }

    while (stack_head) {
        // pop topmost node
        BVHBuildStackNode* current = stack_head;
        stack_head = stack_head->prev;

        BVHNode* node = current->bvh_node;
        bool* indices = current->indices;

        // compute bounding box for current node
        node->vmin.x = INFINITY;
        node->vmin.y = INFINITY;
        node->vmin.z = INFINITY;

        node->vmax.x = -INFINITY;
        node->vmax.y = -INFINITY;
        node->vmax.z = -INFINITY;
        
        int triangle_count = 0;

        for (size_t i = 0; i < mesh->triangle_count; i++) {
            if (indices[i]) {
                for (int j = 0; j < 3; j++) {
                    if (mesh->triangles[i].vertices[j].x < node->vmin.x) {
                        node->vmin.x = mesh->triangles[i].vertices[j].x;
                    }
                    if (mesh->triangles[i].vertices[j].x > node->vmax.x) {
                        node->vmax.x = mesh->triangles[i].vertices[j].x;
                    }

                    if (mesh->triangles[i].vertices[j].y < node->vmin.y) {
                        node->vmin.y = mesh->triangles[i].vertices[j].y;
                    }
                    if (mesh->triangles[i].vertices[j].y > node->vmax.y) {
                        node->vmax.y = mesh->triangles[i].vertices[j].y;
                    }

                    if (mesh->triangles[i].vertices[j].z < node->vmin.z) {
                        node->vmin.z = mesh->triangles[i].vertices[j].z;
                    }
                    if (mesh->triangles[i].vertices[j].z > node->vmax.z) {
                        node->vmax.z = mesh->triangles[i].vertices[j].z;
                    }
                }
                triangle_count++;
            }
        }
        
        node->isLeaf = (triangle_count <= 5 || depth >= 20);
        if (node->isLeaf) {
            // base case : store new triangles in the right place in the reordered triangle array
            node->data.triangles.array = new_triangles;
            node->data.triangles.count = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                if (indices[i]) {
                    node->data.triangles.array[node->data.triangles.count++] = mesh->triangles[i];
                }
            }
            new_triangles += node->data.triangles.count;
        } else {
            Centroid* centroids_by_split_axis = NULL;
            int split_axis = current->depth % 3;
            switch (split_axis) {
            case 0:
                centroids_by_split_axis = centroids_by_x;
                break;
            case 1:
                centroids_by_split_axis = centroids_by_y;
                break;
            case 2:
                centroids_by_split_axis = centroids_by_z;
                break;
            }

            bool* l_indices = malloc(sizeof(bool) * mesh->triangle_count);
            bool* r_indices = malloc(sizeof(bool) * mesh->triangle_count);

            int triangles_seen = 0;
            for (size_t i = 0; i < mesh->triangle_count; i++) {
                size_t idx = centroids_by_split_axis[i].idx;
                l_indices[idx] = false;
                r_indices[idx] = false;
                if (indices[idx]) {
                    if (triangles_seen < triangle_count / 2) {
                        l_indices[idx] = true;
                    } else {
                        r_indices[idx] = true;
                    }
                    triangles_seen++;
                }
            }

            node->data.children.left = malloc(sizeof(BVHNode));
            node->data.children.right = malloc(sizeof(BVHNode));
            
            // push right child on stack
            BVHBuildStackNode* new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.right;
            new_stack_element->indices = r_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;

            // push left child on stack
            new_stack_element = malloc(sizeof(BVHBuildStackNode));
            new_stack_element->bvh_node = node->data.children.left;
            new_stack_element->indices = l_indices;
            new_stack_element->depth = current->depth + 1;
            
            new_stack_element->prev = stack_head;
            stack_head = new_stack_element;
        }
        // cleanup
        free(current->indices);
        free(current);
    }
}